

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

void __thiscall
embree::avx::HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
::splitFallback(HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
                *this,PrimInfoExtRange *set,PrimInfoExtRange *lset,PrimInfoExtRange *rset)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Vec3fx VVar3;
  unsigned_long uVar4;
  ulong uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  ulong uVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar11;
  ulong uVar12;
  size_t lweight;
  unsigned_long uVar13;
  size_t rweight;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [16];
  
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar10 = uVar5 + uVar4 >> 1;
  paVar11 = &this->prims0[uVar4].upper.field_0;
  aVar15.m128[2] = INFINITY;
  aVar15._0_8_ = 0x7f8000007f800000;
  aVar15.m128[3] = INFINITY;
  aVar14.m128[2] = -INFINITY;
  aVar14._0_8_ = 0xff800000ff800000;
  aVar14.m128[3] = -INFINITY;
  lweight = 0;
  aVar6 = aVar14;
  aVar8 = aVar15;
  for (uVar13 = uVar4; uVar13 < uVar10; uVar13 = uVar13 + 1) {
    aVar1 = paVar11[-1].field_1;
    aVar2 = paVar11->field_1;
    aVar8.m128 = (__m128)vminps_avx(aVar8.m128,(undefined1  [16])aVar1);
    aVar6.m128 = (__m128)vmaxps_avx(aVar6.m128,(undefined1  [16])aVar2);
    auVar16._0_4_ = aVar1.x + aVar2.x;
    auVar16._4_4_ = aVar1.y + aVar2.y;
    auVar16._8_4_ = aVar1.z + aVar2.z;
    auVar16._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
    aVar15.m128 = (__m128)vminps_avx(aVar15.m128,auVar16);
    aVar14.m128 = (__m128)vmaxps_avx(aVar14.m128,auVar16);
    lweight = lweight + (paVar11[-1].field_1.field_3.u >> 0x1b);
    paVar11 = paVar11 + 2;
  }
  paVar11 = &this->prims0[uVar10].upper.field_0;
  aVar18.m128[2] = INFINITY;
  aVar18._0_8_ = 0x7f8000007f800000;
  aVar18.m128[3] = INFINITY;
  aVar17.m128[2] = -INFINITY;
  aVar17._0_8_ = 0xff800000ff800000;
  aVar17.m128[3] = -INFINITY;
  rweight = 0;
  aVar7 = aVar17;
  aVar9 = aVar18;
  for (uVar12 = uVar10; uVar12 < uVar5; uVar12 = uVar12 + 1) {
    aVar1 = paVar11[-1].field_1;
    VVar3.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar11->field_1;
    aVar9.m128 = (__m128)vminps_avx(aVar9.m128,(undefined1  [16])aVar1);
    aVar7.m128 = (__m128)vmaxps_avx(aVar7.m128,(undefined1  [16])VVar3.field_0);
    auVar19._0_4_ = aVar1.x + VVar3.field_0._0_4_;
    auVar19._4_4_ = aVar1.y + VVar3.field_0._4_4_;
    auVar19._8_4_ = aVar1.z + VVar3.field_0._8_4_;
    auVar19._12_4_ = aVar1.field_3.w + VVar3.field_0._12_4_;
    aVar18.m128 = (__m128)vminps_avx(aVar18.m128,auVar19);
    aVar17.m128 = (__m128)vmaxps_avx(aVar17.m128,auVar19);
    rweight = rweight + (paVar11[-1].field_1.field_3.u >> 0x1b);
    paVar11 = paVar11 + 2;
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar8;
  (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar6;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar15;
  (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar14;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar4;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar10;
  (lset->super_extended_range<unsigned_long>)._ext_end = uVar10;
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar9;
  (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar7;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar18;
  (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar17;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar10;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar5;
  (rset->super_extended_range<unsigned_long>)._ext_end = uVar5;
  if ((set->super_extended_range<unsigned_long>)._ext_end ==
      (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end) {
    return;
  }
  setExtentedRanges(this,set,lset,rset,lweight,rweight);
  moveExtentedRange(this,set,lset,rset);
  return;
}

Assistant:

void splitFallback(const PrimInfoExtRange& set, 
                           PrimInfoExtRange& lset, 
                           PrimInfoExtRange& rset)
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          const size_t center = (begin + end)/2;

          PrimInfo left(empty);
          for (size_t i=begin; i<center; i++) {
            left.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));
          }
          const size_t lweight = left.end;
          
          PrimInfo right(empty);
          for (size_t i=center; i<end; i++) {
            right.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));	
          }
          const size_t rweight = right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,left);
          new (&rset) PrimInfoExtRange(center,end,end,right);

          /* if we have an extended range */
          if (set.has_ext_range()) {
            setExtentedRanges(set,lset,rset,lweight,rweight);
            moveExtentedRange(set,lset,rset);
          }
        }